

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O2

void __thiscall
OpenMD::AngleR::AngleR
          (AngleR *this,SimInfo *info,string *filename,string *sele1,int seleOffset,RealType len,
          int nrbins)

{
  string *psVar1;
  SelectionEvaluator *this_00;
  ostream *poVar2;
  string paramString;
  stringstream params;
  string local_208;
  SelectionManager *local_1e8;
  vector<double,_std::allocator<double>_> *local_1e0;
  SelectionEvaluator *local_1d8;
  SelectionEvaluator *local_1d0;
  SelectionManager *local_1c8;
  string *local_1c0;
  undefined1 local_1b8 [392];
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nrbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__AngleR_002ecc90;
  this->doVect_ = false;
  this->doOffset_ = true;
  this->doOffset2_ = false;
  local_1c0 = &this->selectionScript1_;
  std::__cxx11::string::string((string *)local_1c0,(string *)sele1);
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  (this->selectionScript2_)._M_string_length = 0;
  (this->selectionScript2_).field_2._M_local_buf[0] = '\0';
  local_1e8 = &this->seleMan1_;
  SelectionManager::SelectionManager(local_1e8,info);
  local_1c8 = &this->seleMan2_;
  SelectionManager::SelectionManager(local_1c8,info);
  local_1d8 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(local_1d8,info);
  local_1d0 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(local_1d0,info);
  this->seleOffset_ = seleOffset;
  this->len_ = len;
  this->nRBins_ = nrbins;
  local_1e0 = &this->avgAngleR_;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getPrefix(&local_208,filename);
  this_00 = local_1d8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_208,".AngleR");
  psVar1 = &(this->super_StaticAnalyser).outputFilename_;
  std::__cxx11::string::_M_assign((string *)psVar1);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&local_208);
  SelectionEvaluator::loadScriptString(this_00,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,this_00);
    SelectionManager::setSelectionSet(local_1e8,(SelectionSet *)local_1b8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  this->deltaR_ = this->len_ / (double)this->nRBins_;
  std::vector<double,_std::allocator<double>_>::resize(&this->histogram_,(long)this->nRBins_);
  std::vector<int,_std::allocator<int>_>::resize(&this->count_,(long)this->nRBins_);
  std::vector<double,_std::allocator<double>_>::resize(local_1e0,(long)this->nRBins_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"radial density function Angle(r)",(allocator<char> *)&local_208);
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  std::__cxx11::string::~string((string *)local_1b8);
  getPrefix(&local_208,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_208,".AngleR");
  std::__cxx11::string::_M_assign((string *)psVar1);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::operator<<((ostream *)(local_1b8 + 0x10)," len = ");
  poVar2 = std::ostream::_M_insert<double>(this->len_);
  poVar2 = std::operator<<(poVar2,", nrbins = ");
  std::ostream::operator<<((ostream *)poVar2,this->nRBins_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  return;
}

Assistant:

AngleR::AngleR(SimInfo* info, const std::string& filename,
                 const std::string& sele1, int seleOffset, RealType len,
                 int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      doVect_(false), doOffset_(true), doOffset2_(false),
      selectionScript1_(sele1), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info), seleOffset_(seleOffset), len_(len),
      nRBins_(nrbins) {
    setOutputName(getPrefix(filename) + ".AngleR");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    deltaR_ = len_ / nRBins_;

    histogram_.resize(nRBins_);
    count_.resize(nRBins_);
    avgAngleR_.resize(nRBins_);

    setAnalysisType("radial density function Angle(r)");
    setOutputName(getPrefix(filename) + ".AngleR");
    std::stringstream params;
    params << " len = " << len_ << ", nrbins = " << nRBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }